

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeCommandListGetOrdinal(ze_command_list_handle_t hCommandList,uint32_t *pOrdinal)

{
  ze_result_t zVar1;
  
  if (DAT_0010d408 != (code *)0x0) {
    zVar1 = (*DAT_0010d408)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListGetOrdinal(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        uint32_t* pOrdinal                              ///< [out] command queue group ordinal to which command list is submitted
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetOrdinal = context.zeDdiTable.CommandList.pfnGetOrdinal;
        if( nullptr != pfnGetOrdinal )
        {
            result = pfnGetOrdinal( hCommandList, pOrdinal );
        }
        else
        {
            // generic implementation
        }

        return result;
    }